

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowAggregateExecutorGlobalState::WindowAggregateExecutorGlobalState
          (WindowAggregateExecutorGlobalState *this,WindowAggregateExecutor *executor,
          idx_t group_count,ValidityMask *partition_mask,ValidityMask *order_mask)

{
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> _Var2;
  pointer pWVar3;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> local_30;
  
  WindowExecutorGlobalState::WindowExecutorGlobalState
            (&this->super_WindowExecutorGlobalState,&executor->super_WindowExecutor,group_count,
             partition_mask,order_mask);
  (this->super_WindowExecutorGlobalState).super_WindowExecutorState._vptr_WindowExecutorState =
       (_func_int **)&PTR__WindowAggregateExecutorGlobalState_017aa4e8;
  (this->gsink).
  super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
  .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl =
       (WindowAggregatorState *)0x0;
  this->filter_ref =
       (executor->filter_ref).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  pWVar3 = unique_ptr<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>,_true>
           ::operator->(&executor->aggregator);
  (*pWVar3->_vptr_WindowAggregator[2])
            (&local_30,pWVar3,(executor->super_WindowExecutor).context,group_count,partition_mask);
  _Var2._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (WindowAggregatorState *)0x0;
  _Var1._M_head_impl =
       (this->gsink).
       super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
       .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl;
  (this->gsink).
  super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
  .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (WindowAggregatorState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_WindowAggregatorState + 8))();
    if (local_30._M_head_impl != (WindowAggregatorState *)0x0) {
      (*(local_30._M_head_impl)->_vptr_WindowAggregatorState[1])();
    }
  }
  return;
}

Assistant:

WindowAggregateExecutorGlobalState::WindowAggregateExecutorGlobalState(const WindowAggregateExecutor &executor,
                                                                       const idx_t group_count,
                                                                       const ValidityMask &partition_mask,
                                                                       const ValidityMask &order_mask)
    : WindowExecutorGlobalState(executor, group_count, partition_mask, order_mask),
      filter_ref(executor.filter_ref.get()) {
	gsink = executor.aggregator->GetGlobalState(executor.context, group_count, partition_mask);
}